

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qheaderview.cpp
# Opt level: O0

QSize __thiscall QHeaderView::sizeHint(QHeaderView *this)

{
  bool bVar1;
  int iVar2;
  QHeaderViewPrivate *pQVar3;
  int *piVar4;
  QSize QVar5;
  QSize *in_RDI;
  long in_FS_OFFSET;
  int checked_1;
  int j;
  int checked;
  int sectionCount;
  QHeaderViewPrivate *d;
  QSize hint_1;
  QSize hint;
  int i;
  undefined8 in_stack_ffffffffffffff88;
  undefined6 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff96;
  undefined1 uVar6;
  undefined1 in_stack_ffffffffffffff97;
  undefined1 uVar7;
  undefined4 in_stack_ffffffffffffffa0;
  int iVar8;
  int in_stack_ffffffffffffffa4;
  int logicalIndex;
  int iVar9;
  int local_30;
  QSize local_2c;
  undefined1 *local_24;
  int local_1c;
  QSize local_18;
  QSize local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = d_func((QHeaderView *)0x83545a);
  bVar1 = QSize::isValid((QSize *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  if (bVar1) {
    local_10 = pQVar3->cachedSizeHint;
  }
  else {
    QSize::QSize((QSize *)CONCAT17(in_stack_ffffffffffffff97,
                                   CONCAT16(in_stack_ffffffffffffff96,in_stack_ffffffffffffff90)),
                 (int)((ulong)in_stack_ffffffffffffff88 >> 0x20),(int)in_stack_ffffffffffffff88);
    pQVar3->cachedSizeHint = local_18;
    iVar2 = count((QHeaderView *)
                  CONCAT17(in_stack_ffffffffffffff97,
                           CONCAT16(in_stack_ffffffffffffff96,in_stack_ffffffffffffff90)));
    iVar9 = 0;
    for (local_1c = 0; uVar7 = iVar9 < 100 && local_1c < iVar2, iVar9 < 100 && local_1c < iVar2;
        local_1c = local_1c + 1) {
      bVar1 = isSectionHidden((QHeaderView *)CONCAT44(iVar2,iVar9),in_stack_ffffffffffffffa4);
      if (!bVar1) {
        iVar9 = iVar9 + 1;
        local_24 = &DAT_aaaaaaaaaaaaaaaa;
        local_24 = (undefined1 *)(**(code **)((long)*in_RDI + 0x308))(in_RDI,local_1c);
        local_2c = QSize::expandedTo(in_RDI,(QSize *)CONCAT17(uVar7,CONCAT16(
                                                  in_stack_ffffffffffffff96,
                                                  in_stack_ffffffffffffff90)));
        pQVar3->cachedSizeHint = local_2c;
      }
    }
    local_30 = iVar2 + -100;
    piVar4 = qMax<int>(&local_1c,&local_30);
    local_1c = *piVar4;
    iVar8 = 0;
    logicalIndex = iVar2;
    while( true ) {
      logicalIndex = logicalIndex + -1;
      uVar6 = local_1c <= logicalIndex && iVar8 < 100;
      if (local_1c > logicalIndex || iVar8 >= 100) break;
      bVar1 = isSectionHidden((QHeaderView *)CONCAT44(iVar2,iVar9),logicalIndex);
      if (!bVar1) {
        iVar8 = iVar8 + 1;
        (**(code **)((long)*in_RDI + 0x308))(in_RDI,logicalIndex);
        QVar5 = QSize::expandedTo(in_RDI,(QSize *)CONCAT17(uVar7,CONCAT16(uVar6,
                                                  in_stack_ffffffffffffff90)));
        pQVar3->cachedSizeHint = QVar5;
      }
    }
    local_10 = pQVar3->cachedSizeHint;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_10;
  }
  __stack_chk_fail();
}

Assistant:

QSize QHeaderView::sizeHint() const
{
    Q_D(const QHeaderView);
    if (d->cachedSizeHint.isValid())
        return d->cachedSizeHint;
    d->cachedSizeHint = QSize(0, 0); //reinitialize the cached size hint
    const int sectionCount = count();

    // get size hint for the first n sections
    int i = 0;
    for (int checked = 0; checked < 100 && i < sectionCount; ++i) {
        if (isSectionHidden(i))
            continue;
        checked++;
        QSize hint = sectionSizeFromContents(i);
        d->cachedSizeHint = d->cachedSizeHint.expandedTo(hint);
    }
    // get size hint for the last n sections
    i = qMax(i, sectionCount - 100 );
    for (int j = sectionCount - 1, checked = 0; j >= i && checked < 100; --j) {
        if (isSectionHidden(j))
            continue;
        checked++;
        QSize hint = sectionSizeFromContents(j);
        d->cachedSizeHint = d->cachedSizeHint.expandedTo(hint);
    }
    return d->cachedSizeHint;
}